

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmfwfilm.c
# Opt level: O2

MMFWFilmEntry * MMFWFilmEntry_New(MMFW *mmfw,int i)

{
  uint uVar1;
  MMFWFilmEntry *pMVar2;
  uint8_t *__ptr;
  uint uVar3;
  int iVar4;
  ulong __size;
  
  pMVar2 = (MMFWFilmEntry *)malloc(0x10);
  if (pMVar2 != (MMFWFilmEntry *)0x0) {
    uVar1 = mmfw->offsets[i];
    uVar3 = mmfw->offsets[(long)i + 1] - uVar1;
    __size = (ulong)uVar3;
    pMVar2->length = uVar3;
    __ptr = (uint8_t *)malloc(__size);
    pMVar2->data = __ptr;
    fseek((FILE *)mmfw->fp,(ulong)uVar1,0);
    while (iVar4 = (int)__size, __size = (ulong)(iVar4 - 1), iVar4 != 0) {
      fread(__ptr,1,1,(FILE *)mmfw->fp);
      __ptr = __ptr + 1;
    }
  }
  return pMVar2;
}

Assistant:

MMFWFilmEntry *
MMFWFilmEntry_New(MMFW *mmfw, int i)
{
	MMFWFilmEntry *film = malloc(sizeof(MMFWFilmEntry));

	if (!film) {
		return NULL;
	}

	uint32_t offset = mmfw->offsets[i];
	uint32_t length = mmfw->offsets[i+1] - offset;

	film->length = length;
	film->data = malloc(film->length);

	fseek(mmfw->fp, (long)offset, SEEK_SET);

	/* XXX one byte at a time :\ */
	uint8_t *datap = film->data;
	for (int i = 0; i < film->length; i++) {
		fread(datap, 1, 1, mmfw->fp);
		datap++;
	}

	return film;
}